

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_map_init_alloc(size_t allocation_len,wally_map **output)

{
  wally_map *pwVar1;
  int ret;
  wally_map *result;
  wally_map **output_local;
  size_t allocation_len_local;
  
  if (output == (wally_map **)0x0) {
    allocation_len_local._4_4_ = -2;
  }
  else {
    *output = (wally_map *)0x0;
    pwVar1 = (wally_map *)wally_calloc(0x18);
    *output = pwVar1;
    if (*output == (wally_map *)0x0) {
      allocation_len_local._4_4_ = -3;
    }
    else {
      pwVar1 = *output;
      allocation_len_local._4_4_ = wally_map_init(allocation_len,pwVar1);
      if (allocation_len_local._4_4_ != 0) {
        wally_free(pwVar1);
        *output = (wally_map *)0x0;
      }
    }
  }
  return allocation_len_local._4_4_;
}

Assistant:

int wally_map_init_alloc(size_t allocation_len, struct wally_map **output)
{
    struct wally_map *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_map);

    ret = wally_map_init(allocation_len, result);
    if (ret != WALLY_OK) {
        wally_free(result);
        *output = NULL;
    }
    return ret;
}